

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_struct_tostring
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  pointer pptVar5;
  t_dart_generator *this_00;
  char *pcVar6;
  t_field *ptVar7;
  string field_name;
  string local_220;
  e_req local_1fc;
  t_struct *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1f8 = tstruct;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"String toString()");
  std::__cxx11::string::string((string *)&local_1d0," ",(allocator *)&local_220);
  scope_up(this,out,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"StringBuffer ret = new StringBuffer(\"");
  ptVar1 = local_1f8;
  iVar3 = (*(local_1f8->super_t_type).super_t_doc._vptr_t_doc[3])(local_1f8);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = std::operator<<(poVar4,"(\");");
  std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  pptVar5 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar2 = true;
  do {
    if (pptVar5 ==
        (local_1f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(\")\");");
      std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"return ret.toString();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_1b0,(string *)&endl2_abi_cxx11_);
      scope_down(this,out,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      return;
    }
    ptVar7 = *pptVar5;
    local_1fc = ptVar7->req_;
    if (local_1fc == T_OPTIONAL) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (");
      generate_isset_check_abi_cxx11_(&local_220,this,*pptVar5);
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      std::operator<<(poVar4,")");
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::string((string *)&local_70," ",(allocator *)&local_220);
      scope_up(this,out,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      ptVar7 = *pptVar5;
    }
    this_00 = (t_dart_generator *)&ptVar7->name_;
    std::__cxx11::string::string((string *)&local_50,(string *)this_00);
    get_member_name(&local_220,this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(\", \");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"ret.write(\"");
    poVar4 = std::operator<<(poVar4,(string *)&local_220);
    poVar4 = std::operator<<(poVar4,":\");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    bVar2 = type_can_be_null(this,ptVar7->type_);
    if (bVar2) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (this.");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      std::operator<<(poVar4," == null)");
      std::__cxx11::string::string((string *)&local_90," ",(allocator *)&local_1f0);
      scope_up(this,out,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(\"null\");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_b0," else",(allocator *)&local_1f0);
      scope_down(this,out,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_d0," ",(allocator *)&local_1f0);
      scope_up(this,out,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    iVar3 = (*(ptVar7->type_->super_t_doc)._vptr_t_doc[7])();
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ptVar7->type_->super_t_doc)._vptr_t_doc[10])();
      if ((char)iVar3 == '\0') {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"ret.write(this.");
        poVar4 = std::operator<<(poVar4,(string *)&local_220);
        pcVar6 = ");";
        goto LAB_001962ea;
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"String ");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      poVar4 = std::operator<<(poVar4,"_name = ");
      get_ttype_class_name_abi_cxx11_(&local_1f0,this,ptVar7->type_);
      poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,".VALUES_TO_NAMES[this.");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      poVar4 = std::operator<<(poVar4,"];");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      std::operator<<(poVar4,"_name != null)");
      std::__cxx11::string::string((string *)&local_f0," ",(allocator *)&local_1f0);
      scope_up(this,out,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      poVar4 = std::operator<<(poVar4,"_name);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(\" (\");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_130,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(this.");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (");
      poVar4 = std::operator<<(poVar4,(string *)&local_220);
      std::operator<<(poVar4,"_name != null)");
      std::__cxx11::string::string((string *)&local_110," ",(allocator *)&local_1f0);
      scope_up(this,out,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"ret.write(\")\");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_150,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      pcVar6 = "ret.write(\"BINARY\");";
LAB_001962ea:
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_170,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    if (local_1fc == T_OPTIONAL) {
      std::__cxx11::string::string((string *)&local_190,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_220);
    pptVar5 = pptVar5 + 1;
    bVar2 = false;
  } while( true );
}

Assistant:

void t_dart_generator::generate_dart_struct_tostring(ostream& out,
                                                   t_struct* tstruct) {
  indent(out) << "String toString()";
  scope_up(out);

  indent(out) << "StringBuffer ret = new StringBuffer(\""
              << tstruct->get_name() << "(\");" << endl2;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }

    t_field* field = (*f_iter);
    std::string field_name = get_member_name(field->get_name());

    if (!first) {
      indent(out) << "ret.write(\", \");" << endl;
    }
    indent(out) << "ret.write(\"" << field_name << ":\");" << endl;
    bool can_be_null = type_can_be_null(field->get_type());
    if (can_be_null) {
      indent(out) << "if (this." << field_name << " == null)";
      scope_up(out);
      indent(out) << "ret.write(\"null\");" << endl;
      scope_down(out, " else");
      scope_up(out);
    }

    if (field->get_type()->is_binary()) {
      indent(out) << "ret.write(\"BINARY\");" << endl;
    } else if (field->get_type()->is_enum()) {
      indent(out) << "String " << field_name << "_name = "
                  << get_ttype_class_name(field->get_type())
                  << ".VALUES_TO_NAMES[this." << field_name << "];" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(" << field_name << "_name);" << endl;
      indent(out) << "ret.write(\" (\");" << endl;
      scope_down(out);
      indent(out) << "ret.write(this." << field_name << ");" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(\")\");" << endl;
      scope_down(out);
    } else {
      indent(out) << "ret.write(this." << field_name << ");" << endl;
    }

    if (can_be_null) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }

    out << endl;
    first = false;
  }

  indent(out) << "ret.write(\")\");" << endl2;

  indent(out) << "return ret.toString();" << endl;

  scope_down(out, endl2);
}